

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O1

vector<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_> * __thiscall
GameEngine::getLightPlayers
          (vector<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_>
           *__return_storage_ptr__,GameEngine *this)

{
  pointer psVar1;
  pointer psVar2;
  undefined1 local_41;
  shared_ptr<LightPlayer> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<LightPlayer>,_std::allocator<std::shared_ptr<LightPlayer>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = (this->players).
           super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->players).
           super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    do {
      local_40.super___shared_ptr<LightPlayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<LightPlayer,std::allocator<LightPlayer>,Player&>
                (&local_40.super___shared_ptr<LightPlayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (LightPlayer **)&local_40,(allocator<LightPlayer> *)&local_41,
                 (psVar2->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      std::vector<std::shared_ptr<LightPlayer>,std::allocator<std::shared_ptr<LightPlayer>>>::
      emplace_back<std::shared_ptr<LightPlayer>>
                ((vector<std::shared_ptr<LightPlayer>,std::allocator<std::shared_ptr<LightPlayer>>>
                  *)__return_storage_ptr__,&local_40);
      if (local_40.super___shared_ptr<LightPlayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<LightPlayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<LightPlayer> > GameEngine::getLightPlayers() {
  std::vector<std::shared_ptr<LightPlayer> > lightPlayers;

  for (const auto &player : players) {
    lightPlayers.push_back(std::make_shared<LightPlayer>(*player));
  }

  return lightPlayers;
}